

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O0

ssize_t __thiscall
anon_unknown.dwarf_19c5bf5::File::read(File *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  undefined4 in_register_00000034;
  File *pFStack_48;
  int c;
  size_t i;
  char *out;
  unique_lock<std::mutex> lock;
  size_t n_local;
  void *buffer_local;
  File *this_local;
  
  lock._8_8_ = __buf;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)&out,&this->readMutex);
  pFStack_48 = (File *)0x0;
  do {
    if ((ulong)lock._8_8_ <= pFStack_48) {
      this_local = (File *)lock._8_8_;
LAB_00e29026:
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&out);
      return (ssize_t)this_local;
    }
    iVar1 = fgetc((FILE *)this->f);
    if (iVar1 == -1) {
      this_local = pFStack_48;
      goto LAB_00e29026;
    }
    (&(pFStack_48->super_ReaderWriter).super_Reader.field_0x0)[CONCAT44(in_register_00000034,__fd)]
         = (char)iVar1;
    pFStack_48 = (File *)&(pFStack_48->super_ReaderWriter).super_Reader.field_0x1;
  } while( true );
}

Assistant:

size_t read(void* buffer, size_t n) override {
    std::unique_lock<std::mutex> lock(readMutex);
    auto out = reinterpret_cast<char*>(buffer);
    for (size_t i = 0; i < n; i++) {
      int c = fgetc(f);
      if (c == EOF) {
        return i;
      }
      out[i] = char(c);
    }
    return n;
  }